

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t archive_match_excluded(archive *_a,archive_entry *entry)

{
  int iVar1;
  char *pathname;
  wchar_t local_2c;
  wchar_t magic_test;
  wchar_t r;
  archive_match *a;
  archive_entry *entry_local;
  archive *_a_local;
  
  iVar1 = __archive_check_magic(_a,0xcad11c9,1,"archive_match_excluded_ae");
  if (iVar1 == -0x1e) {
    _a_local._4_4_ = L'\xffffffe2';
  }
  else if (entry == (archive_entry *)0x0) {
    archive_set_error(_a,0x16,"entry is NULL");
    _a_local._4_4_ = L'\xffffffe7';
  }
  else {
    local_2c = L'\0';
    if ((_a[1].magic & 1) != 0) {
      pathname = archive_entry_pathname(entry);
      local_2c = path_excluded((archive_match *)_a,L'\x01',pathname);
      if (local_2c != L'\0') {
        return local_2c;
      }
    }
    if (((_a[1].magic & 2) == 0) ||
       (local_2c = time_excluded((archive_match *)_a,entry), _a_local._4_4_ = local_2c,
       local_2c == L'\0')) {
      if ((_a[1].magic & 4) != 0) {
        local_2c = owner_excluded((archive_match *)_a,entry);
      }
      _a_local._4_4_ = local_2c;
    }
  }
  return _a_local._4_4_;
}

Assistant:

int
archive_match_excluded(struct archive *_a, struct archive_entry *entry)
{
	struct archive_match *a;
	int r;

	archive_check_magic(_a, ARCHIVE_MATCH_MAGIC,
	    ARCHIVE_STATE_NEW, "archive_match_excluded_ae");

	a = (struct archive_match *)_a;
	if (entry == NULL) {
		archive_set_error(&(a->archive), EINVAL, "entry is NULL");
		return (ARCHIVE_FAILED);
	}

	r = 0;
	if (a->setflag & PATTERN_IS_SET) {
#if defined(_WIN32) && !defined(__CYGWIN__)
		r = path_excluded(a, 0, archive_entry_pathname_w(entry));
#else
		r = path_excluded(a, 1, archive_entry_pathname(entry));
#endif
		if (r != 0)
			return (r);
	}

	if (a->setflag & TIME_IS_SET) {
		r = time_excluded(a, entry);
		if (r != 0)
			return (r);
	}

	if (a->setflag & ID_IS_SET)
		r = owner_excluded(a, entry);
	return (r);
}